

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O1

string * __thiscall
wabt::cat<char[2],char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,wabt *this,char (*args) [2],char **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  strlen(*(char **)args);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[2],char_const*,std::__cxx11::string>
            (__return_storage_ptr__,(char (*) [2])this,(char **)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}